

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  uint *puVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float *ptr;
  int iVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 (*pauVar21) [32];
  undefined1 (*pauVar22) [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  auVar5 = _DAT_00550d60;
  auVar24 = _DAT_00550d40;
  auVar23 = in_ZMM5._0_16_;
  iVar13 = bottom_top_blob->elempack;
  iVar10 = bottom_top_blob->dims;
  iVar16 = bottom_top_blob->w;
  uVar20 = bottom_top_blob->h;
  uVar12 = bottom_top_blob->c;
  if (iVar10 == 3) {
    if (0 < (int)uVar12) {
      uVar20 = iVar16 * iVar13 * uVar20;
      pp_Var2 = this->_vptr_PReLU_x86_fma;
      uVar14 = 0;
      auVar37 = ZEXT816(0) << 0x40;
      auVar27._8_8_ = 0x8000000000000000;
      auVar27._0_8_ = 0x8000000000000000;
      auVar23 = vpcmpeqd_avx(auVar23,auVar23);
      auVar30._8_4_ = 0xffff;
      auVar30._0_8_ = 0xffff0000ffff;
      auVar30._12_4_ = 0xffff;
      auVar30._16_4_ = 0xffff;
      auVar30._20_4_ = 0xffff;
      auVar30._24_4_ = 0xffff;
      auVar30._28_4_ = 0xffff;
      do {
        p_Var3 = pp_Var2[-3];
        iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var3);
        uVar9 = 0;
        if (1 < iVar10) {
          uVar9 = uVar14;
        }
        uVar1 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar9 * 4);
        if (iVar10 < 2 || iVar13 != 4) {
          auVar26 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        }
        else {
          auVar26 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar14 * 0x10);
        }
        if (iVar13 == 8 && 1 < iVar10) {
          auVar36 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar14 * 0x20);
        }
        else {
          auVar36._16_16_ = auVar26;
          auVar36._0_16_ = auVar26;
        }
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar17 = 0;
        if (7 < (int)uVar20) {
          iVar10 = 7;
          do {
            auVar34 = vmaxps_avx(*pauVar22,ZEXT1632(auVar37));
            auVar6 = vminps_avx(*pauVar22,ZEXT1632(auVar37));
            auVar25 = vfmadd213ps_fma(auVar6,auVar36,auVar34);
            *pauVar22 = ZEXT1632(auVar25);
            pauVar22 = pauVar22 + 1;
            iVar10 = iVar10 + 8;
            uVar17 = uVar20 & 0xfffffff8;
          } while (iVar10 < (int)uVar20);
        }
        uVar11 = uVar17 | 3;
        while ((int)uVar11 < (int)uVar20) {
          auVar25 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0) << 0x40);
          auVar28 = vminps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0) << 0x40);
          auVar25 = vfmadd213ps_fma(auVar28,auVar26,auVar25);
          *(undefined1 (*) [16])*pauVar22 = auVar25;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar11 = uVar17 + 7;
          uVar17 = uVar17 + 4;
        }
        if ((int)uVar17 < (int)uVar20) {
          uVar9 = CONCAT44(0,~uVar17 + uVar20);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar9;
          auVar28 = vpshufd_avx(auVar33,0x44);
          auVar31 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
          auVar26 = vorps_avx(auVar28,auVar27);
          auVar25 = vorps_avx(auVar28,auVar27);
          uVar19 = 0;
          do {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar19;
            auVar45 = vpshufd_avx(auVar43,0x44);
            auVar49._16_16_ = auVar45;
            auVar49._0_16_ = auVar45;
            auVar34 = vorps_avx(auVar49,auVar24);
            auVar6 = vorps_avx(auVar49,auVar5);
            auVar45 = vorps_avx(auVar28,auVar27);
            auVar60._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
            auVar60._8_4_ = auVar6._24_4_;
            auVar60._12_4_ = auVar6._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar60,auVar45);
            auVar44._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
            auVar44._8_4_ = auVar6._8_4_;
            auVar44._12_4_ = auVar6._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar44,auVar26);
            auVar42 = vpackssdw_avx(auVar57,auVar42);
            auVar61._0_8_ = auVar34._16_8_ ^ 0x8000000000000000;
            auVar61._8_4_ = auVar34._24_4_;
            auVar61._12_4_ = auVar34._28_4_ ^ 0x80000000;
            auVar45 = vpcmpgtq_avx(auVar61,auVar45);
            auVar54._0_8_ = auVar34._0_8_ ^ 0x8000000000000000;
            auVar54._8_4_ = auVar34._8_4_;
            auVar54._12_4_ = auVar34._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar54,auVar25);
            auVar45 = vpackssdw_avx(auVar57,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar23,auVar42 ^ auVar23);
            auVar42 = vpmovsxwd_avx(auVar45);
            auVar57 = vpunpckhwd_avx(auVar45,auVar45);
            auVar56._16_16_ = auVar57;
            auVar56._0_16_ = auVar42;
            auVar6 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(*pauVar22 + uVar19 * 4));
            auVar34 = vcmpps_avx(auVar6,ZEXT1632(auVar37),1);
            auVar34 = vandps_avx(auVar34,auVar30);
            auVar42 = vpackusdw_avx(auVar34._0_16_,auVar34._16_16_);
            auVar45 = vpand_avx(auVar45,auVar42);
            auVar42 = vpmovzxwd_avx(auVar45);
            auVar42 = vpslld_avx(auVar42,0x1f);
            auVar45 = vpunpckhwd_avx(auVar45,auVar45);
            auVar45 = vpslld_avx(auVar45,0x1f);
            auVar50._16_16_ = auVar45;
            auVar50._0_16_ = auVar42;
            auVar8._4_4_ = auVar6._4_4_ * auVar31._4_4_;
            auVar8._0_4_ = auVar6._0_4_ * auVar31._0_4_;
            auVar8._8_4_ = auVar6._8_4_ * auVar31._8_4_;
            auVar8._12_4_ = auVar6._12_4_ * auVar31._12_4_;
            auVar8._16_4_ = auVar6._16_4_ * auVar31._0_4_;
            auVar8._20_4_ = auVar6._20_4_ * auVar31._4_4_;
            auVar8._24_4_ = auVar6._24_4_ * auVar31._8_4_;
            auVar8._28_4_ = auVar6._28_4_;
            auVar34 = vmaskmovps_avx(auVar50,auVar8);
            *(undefined1 (*) [32])(*pauVar22 + uVar19 * 4) = auVar34;
            uVar19 = uVar19 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar19);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar12);
    }
  }
  else if (iVar10 == 2) {
    if (0 < (int)uVar20) {
      uVar12 = iVar13 * iVar16;
      pp_Var2 = this->_vptr_PReLU_x86_fma;
      uVar14 = 0;
      auVar37 = ZEXT816(0) << 0x40;
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar23 = vpcmpeqd_avx(auVar23,auVar23);
      auVar29._8_4_ = 0xffff;
      auVar29._0_8_ = 0xffff0000ffff;
      auVar29._12_4_ = 0xffff;
      auVar29._16_4_ = 0xffff;
      auVar29._20_4_ = 0xffff;
      auVar29._24_4_ = 0xffff;
      auVar29._28_4_ = 0xffff;
      do {
        p_Var3 = pp_Var2[-3];
        iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var3);
        uVar9 = 0;
        if (1 < iVar10) {
          uVar9 = uVar14;
        }
        uVar1 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar9 * 4);
        if (iVar10 < 2 || iVar13 != 4) {
          auVar25 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        }
        else {
          auVar25 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar14 * 0x10);
        }
        if (iVar13 == 8 && 1 < iVar10) {
          auVar35 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0xd8 + (long)p_Var3) + uVar14 * 0x20);
        }
        else {
          auVar35._16_16_ = auVar25;
          auVar35._0_16_ = auVar25;
        }
        pauVar22 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar17 = 0;
        if (7 < (int)uVar12) {
          iVar10 = 7;
          do {
            auVar34 = vmaxps_avx(*pauVar22,ZEXT1632(auVar37));
            auVar6 = vminps_avx(*pauVar22,ZEXT1632(auVar37));
            auVar28 = vfmadd213ps_fma(auVar6,auVar35,auVar34);
            *pauVar22 = ZEXT1632(auVar28);
            pauVar22 = pauVar22 + 1;
            iVar10 = iVar10 + 8;
            uVar17 = uVar12 & 0xfffffff8;
          } while (iVar10 < (int)uVar12);
        }
        uVar11 = uVar17 | 3;
        while ((int)uVar11 < (int)uVar12) {
          auVar28 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0) << 0x40);
          auVar31 = vminps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0) << 0x40);
          auVar28 = vfmadd213ps_fma(auVar31,auVar25,auVar28);
          *(undefined1 (*) [16])*pauVar22 = auVar28;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar11 = uVar17 + 7;
          uVar17 = uVar17 + 4;
        }
        if ((int)uVar17 < (int)uVar12) {
          uVar9 = CONCAT44(0,~uVar17 + uVar12);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar9;
          auVar31 = vpshufd_avx(auVar32,0x44);
          auVar45 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
          auVar25 = vorps_avx(auVar31,auVar26);
          auVar28 = vorps_avx(auVar31,auVar26);
          uVar19 = 0;
          do {
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar19;
            auVar42 = vpshufd_avx(auVar40,0x44);
            auVar47._16_16_ = auVar42;
            auVar47._0_16_ = auVar42;
            auVar34 = vorps_avx(auVar47,auVar24);
            auVar6 = vorps_avx(auVar47,auVar5);
            auVar42 = vorps_avx(auVar31,auVar26);
            auVar58._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
            auVar58._8_4_ = auVar6._24_4_;
            auVar58._12_4_ = auVar6._28_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar58,auVar42);
            auVar41._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
            auVar41._8_4_ = auVar6._8_4_;
            auVar41._12_4_ = auVar6._12_4_ ^ 0x80000000;
            auVar51 = vpcmpgtq_avx(auVar41,auVar25);
            auVar57 = vpackssdw_avx(auVar51,auVar57);
            auVar59._0_8_ = auVar34._16_8_ ^ 0x8000000000000000;
            auVar59._8_4_ = auVar34._24_4_;
            auVar59._12_4_ = auVar34._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar59,auVar42);
            auVar53._0_8_ = auVar34._0_8_ ^ 0x8000000000000000;
            auVar53._8_4_ = auVar34._8_4_;
            auVar53._12_4_ = auVar34._12_4_ ^ 0x80000000;
            auVar51 = vpcmpgtq_avx(auVar53,auVar28);
            auVar42 = vpackssdw_avx(auVar51,auVar42);
            auVar42 = vpackssdw_avx(auVar42 ^ auVar23,auVar57 ^ auVar23);
            auVar57 = vpmovsxwd_avx(auVar42);
            auVar51 = vpunpckhwd_avx(auVar42,auVar42);
            auVar55._16_16_ = auVar51;
            auVar55._0_16_ = auVar57;
            auVar6 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(*pauVar22 + uVar19 * 4));
            auVar34 = vcmpps_avx(auVar6,ZEXT1632(auVar37),1);
            auVar34 = vandps_avx(auVar34,auVar29);
            auVar57 = vpackusdw_avx(auVar34._0_16_,auVar34._16_16_);
            auVar42 = vpand_avx(auVar42,auVar57);
            auVar57 = vpmovzxwd_avx(auVar42);
            auVar57 = vpslld_avx(auVar57,0x1f);
            auVar42 = vpunpckhwd_avx(auVar42,auVar42);
            auVar42 = vpslld_avx(auVar42,0x1f);
            auVar48._16_16_ = auVar42;
            auVar48._0_16_ = auVar57;
            auVar7._4_4_ = auVar6._4_4_ * auVar45._4_4_;
            auVar7._0_4_ = auVar6._0_4_ * auVar45._0_4_;
            auVar7._8_4_ = auVar6._8_4_ * auVar45._8_4_;
            auVar7._12_4_ = auVar6._12_4_ * auVar45._12_4_;
            auVar7._16_4_ = auVar6._16_4_ * auVar45._0_4_;
            auVar7._20_4_ = auVar6._20_4_ * auVar45._4_4_;
            auVar7._24_4_ = auVar6._24_4_ * auVar45._8_4_;
            auVar7._28_4_ = auVar6._28_4_;
            auVar34 = vmaskmovps_avx(auVar48,auVar7);
            *(undefined1 (*) [32])(*pauVar22 + uVar19 * 4) = auVar34;
            uVar19 = uVar19 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar19);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar20);
    }
  }
  else if (iVar10 == 1) {
    iVar13 = iVar13 * iVar16;
    pp_Var2 = this->_vptr_PReLU_x86_fma;
    p_Var3 = pp_Var2[-3];
    pauVar22 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar4 = *(uint **)(&this->field_0xd8 + (long)p_Var3);
    if (*(int *)(&this->field_0xd0 + (long)p_Var3) < 2) {
      uVar20 = *puVar4;
      iVar10 = iVar13 + 7;
      if (-1 < iVar13) {
        iVar10 = iVar13;
      }
      uVar12 = iVar10 >> 3;
      if (7 < iVar13) {
        auVar23 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
        auVar24._16_16_ = auVar23;
        auVar24._0_16_ = auVar23;
        uVar14 = (ulong)uVar12;
        pauVar21 = pauVar22;
        do {
          auVar5 = vmaxps_avx(*pauVar21,ZEXT1632(ZEXT816(0) << 0x40));
          auVar34 = vminps_avx(*pauVar21,ZEXT1632(ZEXT816(0) << 0x40));
          auVar23 = vfmadd213ps_fma(auVar34,auVar24,auVar5);
          *pauVar21 = ZEXT1632(auVar23);
          pauVar21 = pauVar21 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar16 = iVar13 + uVar12 * -8;
      iVar10 = iVar16 + 3;
      if (-1 < iVar16) {
        iVar10 = iVar16;
      }
      auVar23 = ZEXT416(uVar20);
      if (3 < iVar16) {
        auVar37 = vshufps_avx(auVar23,auVar23,0);
        uVar14 = (ulong)(uint)(iVar10 >> 2);
        pauVar15 = (undefined1 (*) [16])(*pauVar22 + (long)(int)(uVar12 * 8) * 4);
        do {
          auVar26 = vmaxps_avx(*pauVar15,ZEXT816(0) << 0x40);
          auVar25 = vminps_avx(*pauVar15,ZEXT816(0) << 0x40);
          auVar26 = vfmadd213ps_fma(auVar25,auVar37,auVar26);
          *pauVar15 = auVar26;
          pauVar15 = pauVar15 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      auVar5 = _DAT_00550d60;
      auVar24 = _DAT_00550d40;
      iVar10 = uVar12 * 8 + (iVar10 >> 2) * 4;
      if (iVar10 < iVar13) {
        lVar18 = (long)iVar10;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (iVar13 - lVar18) - 1;
        auVar37 = vpshufd_avx(auVar37,0x44);
        auVar26 = vshufps_avx(auVar23,auVar23,0);
        uVar9 = 0;
        uVar14 = auVar37._0_8_;
        auVar25._0_8_ = uVar14 ^ 0x8000000000000000;
        auVar25._8_4_ = auVar37._8_4_;
        uVar20 = auVar37._12_4_;
        auVar25._12_4_ = uVar20 ^ 0x80000000;
        auVar28._0_8_ = uVar14 ^ 0x8000000000000000;
        auVar28._8_4_ = auVar25._8_4_;
        auVar28._12_4_ = uVar20 ^ 0x80000000;
        auVar23 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar31._0_8_ = uVar14 ^ 0x8000000000000000;
        auVar31._8_4_ = auVar25._8_4_;
        auVar31._12_4_ = uVar20 ^ 0x80000000;
        auVar34._8_4_ = 0xffff;
        auVar34._0_8_ = 0xffff0000ffff;
        auVar34._12_4_ = 0xffff;
        auVar34._16_4_ = 0xffff;
        auVar34._20_4_ = 0xffff;
        auVar34._24_4_ = 0xffff;
        auVar34._28_4_ = 0xffff;
        do {
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar9;
          auVar37 = vpshufd_avx(auVar45,0x44);
          auVar38._16_16_ = auVar37;
          auVar38._0_16_ = auVar37;
          auVar6 = vorps_avx(auVar38,auVar24);
          auVar38 = vorps_avx(auVar38,auVar5);
          auVar51._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar51._8_4_ = auVar38._24_4_;
          auVar51._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar37 = vpcmpgtq_avx(auVar51,auVar25);
          auVar42._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar42._8_4_ = auVar38._8_4_;
          auVar42._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar45 = vpcmpgtq_avx(auVar42,auVar28);
          auVar37 = vpackssdw_avx(auVar45,auVar37);
          auVar52._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
          auVar52._8_4_ = auVar6._24_4_;
          auVar52._12_4_ = auVar6._28_4_ ^ 0x80000000;
          auVar45 = vpcmpgtq_avx(auVar52,auVar25);
          auVar57._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
          auVar57._8_4_ = auVar6._8_4_;
          auVar57._12_4_ = auVar6._12_4_ ^ 0x80000000;
          auVar42 = vpcmpgtq_avx(auVar57,auVar31);
          auVar45 = vpackssdw_avx(auVar42,auVar45);
          auVar37 = vpackssdw_avx(auVar45 ^ auVar23,auVar37 ^ auVar23);
          auVar45 = vpmovsxwd_avx(auVar37);
          auVar42 = vpunpckhwd_avx(auVar37,auVar37);
          auVar46._16_16_ = auVar42;
          auVar46._0_16_ = auVar45;
          auVar38 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])
                                            (*pauVar22 + uVar9 * 4 + lVar18 * 4));
          auVar6 = vcmpps_avx(auVar38,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar6 = vandps_avx(auVar6,auVar34);
          auVar45 = vpackusdw_avx(auVar6._0_16_,auVar6._16_16_);
          auVar37 = vpand_avx(auVar37,auVar45);
          auVar45 = vpmovzxwd_avx(auVar37);
          auVar45 = vpslld_avx(auVar45,0x1f);
          auVar37 = vpunpckhwd_avx(auVar37,auVar37);
          auVar37 = vpslld_avx(auVar37,0x1f);
          auVar39._16_16_ = auVar37;
          auVar39._0_16_ = auVar45;
          auVar6._4_4_ = auVar38._4_4_ * auVar26._4_4_;
          auVar6._0_4_ = auVar38._0_4_ * auVar26._0_4_;
          auVar6._8_4_ = auVar38._8_4_ * auVar26._8_4_;
          auVar6._12_4_ = auVar38._12_4_ * auVar26._12_4_;
          auVar6._16_4_ = auVar38._16_4_ * auVar26._0_4_;
          auVar6._20_4_ = auVar38._20_4_ * auVar26._4_4_;
          auVar6._24_4_ = auVar38._24_4_ * auVar26._8_4_;
          auVar6._28_4_ = auVar38._28_4_;
          auVar6 = vmaskmovps_avx(auVar39,auVar6);
          *(undefined1 (*) [32])(*pauVar22 + uVar9 * 4 + lVar18 * 4) = auVar6;
          uVar9 = uVar9 + 8;
        } while (((iVar13 - lVar18) + 7U & 0xfffffffffffffff8) != uVar9);
      }
    }
    else {
      iVar10 = iVar13 + 7;
      if (-1 < iVar13) {
        iVar10 = iVar13;
      }
      uVar20 = iVar10 >> 3;
      if (7 < iVar13) {
        uVar14 = (ulong)uVar20;
        lVar18 = 0;
        do {
          auVar24 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar22 + lVar18),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar5 = vminps_avx(*(undefined1 (*) [32])(*pauVar22 + lVar18),
                              ZEXT1632(ZEXT816(0) << 0x40));
          auVar23 = vfmadd132ps_fma(auVar5,auVar24,*(undefined1 (*) [32])((long)puVar4 + lVar18));
          *(undefined1 (*) [32])(*pauVar22 + lVar18) = ZEXT1632(auVar23);
          lVar18 = lVar18 + 0x20;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar16 = iVar13 + uVar20 * -8;
      iVar10 = iVar16 + 3;
      if (-1 < iVar16) {
        iVar10 = iVar16;
      }
      uVar14 = (ulong)(uint)(iVar10 >> 2);
      if (3 < iVar16) {
        lVar18 = (long)(int)(uVar20 * 8) << 2;
        do {
          auVar23 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar22 + lVar18),ZEXT816(0) << 0x40);
          auVar37 = vminps_avx(*(undefined1 (*) [16])(*pauVar22 + lVar18),ZEXT816(0) << 0x40);
          auVar23 = vfmadd132ps_fma(auVar37,auVar23,*(undefined1 (*) [16])((long)puVar4 + lVar18));
          *(undefined1 (*) [16])(*pauVar22 + lVar18) = auVar23;
          lVar18 = lVar18 + 0x10;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar10 = uVar20 * 8 + (iVar10 >> 2) * 4;
      if (iVar10 < iVar13) {
        lVar18 = (long)iVar10;
        do {
          if (*(float *)(*pauVar22 + lVar18 * 4) < 0.0) {
            *(float *)(*pauVar22 + lVar18 * 4) =
                 *(float *)(*pauVar22 + lVar18 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var2[-3]) + lVar18 * 4);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar13);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}